

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O1

size_t __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_length(basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,error_code *ec)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  ushort uVar4;
  ubjson_errc uVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uint8_t type;
  uint8_t buf [1];
  byte local_21 [3];
  ushort uStack_1e;
  uint uStack_1c;
  
  pbVar1 = (this->source_).current_._M_current;
  pbVar2 = (this->source_).end_._M_current;
  uVar8 = (ulong)(pbVar2 != pbVar1);
  if (pbVar2 != pbVar1) {
    uVar9 = 0;
    pbVar3 = pbVar1;
    do {
      (this->source_).current_._M_current = pbVar3 + 1;
      local_21[uVar9] = *pbVar3;
      uVar9 = uVar9 + 1;
      pbVar3 = pbVar3 + 1;
    } while (uVar8 != uVar9);
  }
  sVar7 = uVar8 + (this->source_).position_;
  (this->source_).position_ = sVar7;
  if (pbVar2 == pbVar1) {
    uVar5 = unexpected_eof;
    goto LAB_007bdc11;
  }
  if (local_21[0] < 0x55) {
    if (local_21[0] == 0x49) {
      pbVar1 = (this->source_).current_._M_current;
      uVar8 = 2;
      if ((ulong)((long)pbVar2 - (long)pbVar1) < 2) {
        uVar8 = (long)pbVar2 - (long)pbVar1;
      }
      if (pbVar2 != pbVar1) {
        uVar9 = 0;
        pbVar3 = pbVar1;
        do {
          (this->source_).current_._M_current = pbVar3 + 1;
          local_21[uVar9 + 1] = *pbVar3;
          uVar9 = uVar9 + 1;
          pbVar3 = pbVar3 + 1;
        } while (uVar8 != uVar9);
      }
      (this->source_).position_ = uVar8 + sVar7;
      if ((ulong)((long)pbVar2 - (long)pbVar1) < 2) goto LAB_007bdc4e;
      uVar4 = CONCAT11(local_21[2],local_21[1]) << 8 | (ushort)local_21[2];
      if ((short)uVar4 < 0) goto LAB_007bdc1c;
      uVar8 = (ulong)uVar4;
LAB_007bdc05:
      bVar10 = true;
      goto LAB_007bdc63;
    }
    if (local_21[0] != 0x4c) {
LAB_007bdc09:
      uVar5 = length_must_be_integer;
LAB_007bdc11:
      std::error_code::operator=(ec,uVar5);
      this->more_ = false;
      return 0;
    }
    pbVar1 = (this->source_).current_._M_current;
    uVar8 = 8;
    if ((ulong)((long)pbVar2 - (long)pbVar1) < 8) {
      uVar8 = (long)pbVar2 - (long)pbVar1;
    }
    if (pbVar2 != pbVar1) {
      uVar9 = 0;
      pbVar3 = pbVar1;
      do {
        (this->source_).current_._M_current = pbVar3 + 1;
        local_21[uVar9 + 1] = *pbVar3;
        uVar9 = uVar9 + 1;
        pbVar3 = pbVar3 + 1;
      } while (uVar8 != uVar9);
    }
    (this->source_).position_ = uVar8 + sVar7;
    uVar5 = unexpected_eof;
    if (7 < (ulong)((long)pbVar2 - (long)pbVar1)) {
      uVar6 = CONCAT22(uStack_1e,CONCAT11(local_21[2],local_21[1]));
      uVar8 = (ulong)(uStack_1c >> 0x18) | (((ulong)uStack_1c & 0xff0000) << 0x20) >> 0x28 |
              (((ulong)uStack_1c & 0xff00) << 0x20) >> 0x18 |
              (((ulong)uStack_1c & 0xff) << 0x20) >> 8 | ((ulong)uVar6 & 0xff000000) << 8 |
              ((ulong)uVar6 & 0xff0000) << 0x18 | ((ulong)uVar6 & 0xff00) << 0x28 |
              CONCAT44(uStack_1c,uVar6) << 0x38;
      bVar10 = -1 < (long)uVar8;
      if (bVar10) goto LAB_007bdc63;
      uVar5 = length_is_negative;
    }
  }
  else {
    if (local_21[0] == 0x55) {
      pbVar1 = (this->source_).current_._M_current;
      uVar8 = (ulong)(pbVar2 != pbVar1);
      if (pbVar2 == pbVar1) {
        (this->source_).position_ = sVar7 + uVar8;
      }
      else {
        uVar9 = 0;
        pbVar3 = pbVar1;
        do {
          (this->source_).current_._M_current = pbVar3 + 1;
          local_21[uVar9 + 1] = *pbVar3;
          uVar9 = uVar9 + 1;
          pbVar3 = pbVar3 + 1;
        } while (uVar8 != uVar9);
        (this->source_).position_ = sVar7 + uVar8;
        if (pbVar2 != pbVar1) {
          uVar8 = (ulong)local_21[1];
          goto LAB_007bdc40;
        }
      }
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      uVar8 = 0;
LAB_007bdc40:
      if (pbVar2 == pbVar1) {
        return 0;
      }
      return uVar8;
    }
    if (local_21[0] == 0x6c) {
      pbVar1 = (this->source_).current_._M_current;
      uVar8 = 4;
      if ((ulong)((long)pbVar2 - (long)pbVar1) < 4) {
        uVar8 = (long)pbVar2 - (long)pbVar1;
      }
      if (pbVar2 != pbVar1) {
        uVar9 = 0;
        pbVar3 = pbVar1;
        do {
          (this->source_).current_._M_current = pbVar3 + 1;
          local_21[uVar9 + 1] = *pbVar3;
          uVar9 = uVar9 + 1;
          pbVar3 = pbVar3 + 1;
        } while (uVar8 != uVar9);
      }
      (this->source_).position_ = uVar8 + sVar7;
      if (3 < (ulong)((long)pbVar2 - (long)pbVar1)) {
        uVar6 = (uint)(uStack_1e >> 8) | ((uStack_1e & 0xff) << 0x10) >> 8 |
                (CONCAT11(local_21[2],local_21[1]) & 0xff00) << 8 |
                CONCAT22(uStack_1e,CONCAT11(local_21[2],local_21[1])) << 0x18;
        if ((int)uVar6 < 0) {
LAB_007bdc1c:
          uVar5 = length_is_negative;
          goto LAB_007bdc56;
        }
        uVar8 = (ulong)uVar6;
        goto LAB_007bdc05;
      }
    }
    else {
      if (local_21[0] != 0x69) goto LAB_007bdc09;
      pbVar1 = (this->source_).current_._M_current;
      uVar8 = (ulong)(pbVar2 != pbVar1);
      if (pbVar2 == pbVar1) {
        (this->source_).position_ = sVar7 + uVar8;
      }
      else {
        uVar9 = 0;
        pbVar3 = pbVar1;
        do {
          (this->source_).current_._M_current = pbVar3 + 1;
          local_21[uVar9 + 1] = *pbVar3;
          uVar9 = uVar9 + 1;
          pbVar3 = pbVar3 + 1;
        } while (uVar8 != uVar9);
        (this->source_).position_ = sVar7 + uVar8;
        if (pbVar2 != pbVar1) {
          uVar8 = (ulong)(char)local_21[1];
          if ((long)uVar8 < 0) goto LAB_007bdc1c;
          goto LAB_007bdc05;
        }
      }
    }
LAB_007bdc4e:
    uVar5 = unexpected_eof;
  }
LAB_007bdc56:
  std::error_code::operator=(ec,uVar5);
  this->more_ = false;
  bVar10 = false;
  uVar8 = 0;
LAB_007bdc63:
  if (!bVar10) {
    return 0;
  }
  return uVar8;
}

Assistant:

std::size_t get_length(std::error_code& ec)
    {
        std::size_t length = 0;
        uint8_t type;
        if (source_.read(&type, 1) == 0)
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return length;
        }
        switch (type)
        {
            case jsoncons::ubjson::ubjson_type::int8_type: 
            {
                uint8_t buf[sizeof(int8_t)];
                if (source_.read(buf, sizeof(int8_t)) != sizeof(int8_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int8_t val = binary::big_to_native<int8_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = val;
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::uint8_type: 
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                length = b;
                break;
            }
            case jsoncons::ubjson::ubjson_type::int16_type: 
            {
                uint8_t buf[sizeof(int16_t)];
                if (source_.read(buf, sizeof(int16_t)) != sizeof(int16_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int16_t val = binary::big_to_native<int16_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = val;
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)];
                if (source_.read(buf, sizeof(int32_t)) != sizeof(int32_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int32_t val = binary::big_to_native<int32_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = static_cast<std::size_t>(val);
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)];
                if (source_.read(buf, sizeof(int64_t)) != sizeof(int64_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int64_t val = binary::big_to_native<int64_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = (std::size_t)val;
                    if (length != (uint64_t)val)
                    {
                        ec = ubjson_errc::number_too_large;
                        more_ = false;
                        return length;
                    }
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            default:
            {
                ec = ubjson_errc::length_must_be_integer;
                more_ = false;
                return length;
            }
        }
        return length;
    }